

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_up_testcase_failure_tests.cpp
# Opt level: O0

void TestSetUpFailure::SetUpTestSuite(void)

{
  Fixed *fixed;
  AssertionHelper local_1d0;
  Fixed local_190;
  
  memset(&local_190,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_190);
  fixed = iutest::AssertionHelper::Fixed::operator<<
                    (&local_190,(char (*) [24])"SetUp TestSuite Failed.");
  iutest::AssertionHelper::AssertionHelper
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/set_up_testcase_failure_tests.cpp"
             ,0x1c,"Failed.\n",kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1d0,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_1d0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_190);
  return;
}

Assistant:

static void SetUpTestSuite()
    {
        IUTEST_FAIL() << "SetUp TestSuite Failed.";
    }